

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::LRUCache::~LRUCache(LRUCache *this)

{
  LRUHandle *pLVar1;
  LRUHandle **ppLVar2;
  LRUHandle *e;
  
  if ((this->in_use_).next != &this->in_use_) {
    __assert_fail("in_use_.next == &in_use_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                  ,0xce,"leveldb::(anonymous namespace)::LRUCache::~LRUCache()");
  }
  e = (this->lru_).next;
  while( true ) {
    if (e == &this->lru_) {
      ppLVar2 = (this->table_).list_;
      if (ppLVar2 != (LRUHandle **)0x0) {
        operator_delete__(ppLVar2);
        return;
      }
      return;
    }
    if (e->in_cache == false) break;
    pLVar1 = e->next;
    e->in_cache = false;
    if (e->refs != 1) {
      __assert_fail("e->refs == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                    ,0xd3,"leveldb::(anonymous namespace)::LRUCache::~LRUCache()");
    }
    Unref(this,e);
    e = pLVar1;
  }
  __assert_fail("e->in_cache",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                ,0xd1,"leveldb::(anonymous namespace)::LRUCache::~LRUCache()");
}

Assistant:

LRUCache::~LRUCache() {
  assert(in_use_.next == &in_use_);  // Error if caller has an unreleased handle
  for (LRUHandle* e = lru_.next; e != &lru_;) {
    LRUHandle* next = e->next;
    assert(e->in_cache);
    e->in_cache = false;
    assert(e->refs == 1);  // Invariant of lru_ list.
    Unref(e);
    e = next;
  }
}